

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync_common.hpp
# Opt level: O3

void __thiscall
oqpi::global_sync_object<oqpi::posix_mutex>::global_sync_object<bool&>
          (global_sync_object<oqpi::posix_mutex> *this,string *name,
          sync_object_creation_options creationOption,bool *args)

{
  pointer pcVar1;
  
  posix_mutex::posix_mutex(&this->super_posix_mutex,name,creationOption,*args);
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name_,pcVar1,pcVar1 + name->_M_string_length);
  return;
}

Assistant:

global_sync_object(const std::string &name, sync_object_creation_options creationOption, _Args &&...args)
            : _Impl(name, creationOption, std::forward<_Args>(args)...)
            , name_(name)
        {}